

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O1

void __thiscall
notch::core::SharedBuffers::allocate(SharedBuffers *this,size_t nInputs,size_t nOutputs)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  valarray<float> *pvVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined1 local_39;
  valarray<float> *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_30;
  double local_28;
  size_t local_20;
  size_t local_18;
  
  peVar1 = (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if ((peVar1 == (element_type *)0x0) ||
     ((this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0)) {
    local_20 = nOutputs;
    local_18 = nInputs;
    if (peVar1 == (element_type *)0x0) {
      local_28 = 0.0;
      local_38 = (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::valarray<float>,std::allocator<std::valarray<float>>,double,unsigned_long&>
                (&_Stack_30,&local_38,(allocator<std::valarray<float>_> *)&local_39,&local_28,
                 &local_18);
      _Var4._M_pi = _Stack_30._M_pi;
      pvVar3 = local_38;
      local_38 = (valarray<float> *)0x0;
      _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (this->inputBuffer).
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pvVar3;
      (this->inputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
      }
    }
    if ((this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      local_28 = 0.0;
      local_38 = (element_type *)0x0;
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<std::valarray<float>,std::allocator<std::valarray<float>>,double,unsigned_long&>
                (&_Stack_30,&local_38,(allocator<std::valarray<float>_> *)&local_39,&local_28,
                 &local_20);
      _Var4._M_pi = _Stack_30._M_pi;
      pvVar3 = local_38;
      local_38 = (valarray<float> *)0x0;
      _Stack_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var2 = (this->outputBuffer).
               super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
      (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = pvVar3;
      (this->outputBuffer).super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var4._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      if (_Stack_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_30._M_pi);
      }
    }
  }
  return;
}

Assistant:

void allocate(size_t nInputs, size_t nOutputs) {
        if (ready()) {
            return;
        }
        if (!inputBuffer) {
            inputBuffer = std::make_shared<Array>(0.0, nInputs);
        }
        if (!outputBuffer) {
            outputBuffer = std::make_shared<Array>(0.0, nOutputs);
        }
    }